

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt tt_cmap10_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  pFVar1 = cmap->data;
  uVar2 = *(uint *)(pFVar1 + 0xc);
  uVar3 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = 0;
  uVar4 = char_code - uVar3;
  if ((uVar3 <= char_code) &&
     (uVar3 = *(uint *)(pFVar1 + 0x10),
     uVar4 < (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18))) {
    uVar2 = (uint)(ushort)(*(ushort *)(pFVar1 + (ulong)(uVar4 * 2) + 0x14) << 8 |
                          *(ushort *)(pFVar1 + (ulong)(uVar4 * 2) + 0x14) >> 8);
  }
  return uVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap10_char_index( TT_CMap    cmap,
                        FT_UInt32  char_code )
  {
    FT_Byte*   table  = cmap->data;
    FT_UInt    result = 0;
    FT_Byte*   p      = table + 12;
    FT_UInt32  start  = TT_NEXT_ULONG( p );
    FT_UInt32  count  = TT_NEXT_ULONG( p );
    FT_UInt32  idx;


    if ( char_code < start )
      return 0;

    idx = char_code - start;

    if ( idx < count )
    {
      p     += 2 * idx;
      result = TT_PEEK_USHORT( p );
    }

    return result;
  }